

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ulong uVar1;
  ulong *puVar2;
  LogMessage *other;
  Message *pMVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong *puVar6;
  ThreadSafeArena *this_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (sub_message != (Message *)0x0) {
    puVar2 = (ulong *)(sub_message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)puVar2 & 2) == 0) {
      puVar5 = puVar2;
      if (((ulong)puVar2 & 1) != 0) {
        puVar5 = *(ulong **)((ulong)puVar2 & 0xfffffffffffffffc);
      }
    }
    else {
      puVar5 = (ulong *)0x0;
    }
    if (puVar5 != (ulong *)0x0) {
      if (((ulong)puVar2 & 2) == 0) {
        if (((ulong)puVar2 & 1) != 0) {
          puVar2 = *(ulong **)((ulong)puVar2 & 0xfffffffffffffffc);
        }
      }
      else {
        puVar2 = (ulong *)0x0;
      }
      uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
      puVar5 = (ulong *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar5 = (ulong *)*puVar5;
      }
      if (puVar2 != puVar5) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x7f9);
        other = internal::LogMessage::operator<<
                          (&local_60,
                           "CHECK failed: sub_message == nullptr || sub_message->GetOwningArena() == nullptr || sub_message->GetOwningArena() == message->GetArenaForAllocation(): "
                          );
        internal::LogFinisher::operator=(&local_61,other);
        internal::LogMessage::~LogMessage(&local_60);
      }
    }
  }
  if (sub_message != (Message *)0x0) {
    puVar2 = (ulong *)(sub_message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)puVar2 & 2) == 0) {
      puVar5 = puVar2;
      if (((ulong)puVar2 & 1) != 0) {
        puVar5 = *(ulong **)((ulong)puVar2 & 0xfffffffffffffffc);
      }
    }
    else {
      puVar5 = (ulong *)0x0;
    }
    uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
    puVar6 = (ulong *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar6 = (ulong *)*puVar6;
    }
    if (puVar5 != puVar6) {
      if (((ulong)puVar2 & 2) == 0) {
        if (((ulong)puVar2 & 1) != 0) {
          puVar2 = *(ulong **)((ulong)puVar2 & 0xfffffffffffffffc);
        }
      }
      else {
        puVar2 = (ulong *)0x0;
      }
      if (puVar2 == (ulong *)0x0) {
        puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          puVar4 = (undefined8 *)*puVar4;
        }
        if (puVar4 != (undefined8 *)0x0) {
          this_00 = (ThreadSafeArena *)(uVar1 & 0xfffffffffffffffc);
          if ((uVar1 & 1) != 0) {
            this_00 = *(ThreadSafeArena **)this_00;
          }
          internal::ThreadSafeArena::AddCleanup
                    (this_00,sub_message,
                     internal::arena_delete_object<google::protobuf::MessageLite>);
          goto LAB_0039d97d;
        }
      }
      pMVar3 = MutableMessage(this,message,field,(MessageFactory *)0x0);
      (*(pMVar3->super_MessageLite)._vptr_MessageLite[0xd])(pMVar3,sub_message);
      return;
    }
  }
LAB_0039d97d:
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  GOOGLE_DCHECK(sub_message == nullptr || sub_message->GetOwningArena() == nullptr ||
         sub_message->GetOwningArena() == message->GetArenaForAllocation());
  CheckInvalidAccess(schema_, field);

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != nullptr &&
      sub_message->GetOwningArena() != message->GetArenaForAllocation()) {
    if (sub_message->GetOwningArena() == nullptr &&
        message->GetArenaForAllocation() != nullptr) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArenaForAllocation()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}